

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktDrawCreateInfoUtil.cpp
# Opt level: O0

SubpassDescription * __thiscall
vkt::Draw::SubpassDescription::operator=(SubpassDescription *this,SubpassDescription *rhs)

{
  bool bVar1;
  reference pvVar2;
  reference pvVar3;
  SubpassDescription *rhs_local;
  SubpassDescription *this_local;
  
  memcpy(this,rhs,0x48);
  std::vector<vk::VkAttachmentReference,_std::allocator<vk::VkAttachmentReference>_>::operator=
            (&this->m_inputAttachments,&rhs->m_inputAttachments);
  std::vector<vk::VkAttachmentReference,_std::allocator<vk::VkAttachmentReference>_>::operator=
            (&this->m_colorAttachments,&rhs->m_colorAttachments);
  std::vector<vk::VkAttachmentReference,_std::allocator<vk::VkAttachmentReference>_>::operator=
            (&this->m_resolveAttachments,&rhs->m_resolveAttachments);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=
            (&this->m_preserveAttachments,&rhs->m_preserveAttachments);
  this->m_depthStencilAttachment = rhs->m_depthStencilAttachment;
  bVar1 = std::vector<vk::VkAttachmentReference,_std::allocator<vk::VkAttachmentReference>_>::empty
                    (&this->m_inputAttachments);
  if (!bVar1) {
    pvVar2 = std::vector<vk::VkAttachmentReference,_std::allocator<vk::VkAttachmentReference>_>::
             operator[](&this->m_inputAttachments,0);
    (this->super_VkSubpassDescription).pInputAttachments = pvVar2;
  }
  bVar1 = std::vector<vk::VkAttachmentReference,_std::allocator<vk::VkAttachmentReference>_>::empty
                    (&this->m_colorAttachments);
  if (!bVar1) {
    pvVar2 = std::vector<vk::VkAttachmentReference,_std::allocator<vk::VkAttachmentReference>_>::
             operator[](&this->m_colorAttachments,0);
    (this->super_VkSubpassDescription).pColorAttachments = pvVar2;
  }
  bVar1 = std::vector<vk::VkAttachmentReference,_std::allocator<vk::VkAttachmentReference>_>::empty
                    (&this->m_resolveAttachments);
  if (!bVar1) {
    pvVar2 = std::vector<vk::VkAttachmentReference,_std::allocator<vk::VkAttachmentReference>_>::
             operator[](&this->m_resolveAttachments,0);
    (this->super_VkSubpassDescription).pResolveAttachments = pvVar2;
  }
  (this->super_VkSubpassDescription).pDepthStencilAttachment = &this->m_depthStencilAttachment;
  bVar1 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::empty
                    (&this->m_preserveAttachments);
  if (!bVar1) {
    pvVar3 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       (&this->m_preserveAttachments,0);
    (this->super_VkSubpassDescription).pPreserveAttachments = pvVar3;
  }
  return this;
}

Assistant:

SubpassDescription& SubpassDescription::operator= (const SubpassDescription& rhs)
{
	*static_cast<vk::VkSubpassDescription*>(this) = rhs;

	m_inputAttachments		= rhs.m_inputAttachments;
	m_colorAttachments		= rhs.m_colorAttachments;
	m_resolveAttachments	= rhs.m_resolveAttachments;
	m_preserveAttachments	= rhs.m_preserveAttachments;
	m_depthStencilAttachment = rhs.m_depthStencilAttachment;

	if (!m_inputAttachments.empty())
		pInputAttachments = &m_inputAttachments[0];

	if (!m_colorAttachments.empty())
		pColorAttachments = &m_colorAttachments[0];

	if (!m_resolveAttachments.empty())
		pResolveAttachments = &m_resolveAttachments[0];

	pDepthStencilAttachment = &m_depthStencilAttachment;

	if (!m_preserveAttachments.empty())
		pPreserveAttachments = &m_preserveAttachments[0];

	return *this;
}